

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase1016::run(TestCase1016 *this)

{
  bool bVar1;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar2;
  Reader value;
  Builder local_1a8;
  Fault f;
  Builder root;
  Builder local_138;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,6,FIXED_SIZE);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAnyPointer>
            (&root,&builder.super_MessageBuilder);
  local_1a8.builder.segment = root._builder.segment;
  local_1a8.builder.capTable = root._builder.capTable;
  local_1a8.builder.pointer = root._builder.pointers;
  AnyPointer::Builder::initAs<capnproto_test::capnp::test::TestOldVersion>
            ((BuilderFor<capnproto_test::capnp::test::TestOldVersion> *)&f,&local_1a8);
  value.super_StringPtr.content.size_ = 4;
  value.super_StringPtr.content.ptr = "foo";
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld2((Builder *)&f,value);
  AVar2 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
  if ((AVar2.size_ != 1) && (kj::_::Debug::minSeverity < 3)) {
    local_1a8.builder.segment = (SegmentBuilder *)CONCAT44(local_1a8.builder.segment._4_4_,1);
    AVar2 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
    f.exception = (Exception *)AVar2.size_;
    kj::_::Debug::log<char_const(&)[65],unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x401,ERROR,
               "\"failed: expected \" \"(1u) == (builder.getSegmentsForOutput().size())\", 1u, builder.getSegmentsForOutput().size()"
               ,(char (*) [65])"failed: expected (1u) == (builder.getSegmentsForOutput().size())",
               (uint *)&local_1a8,(unsigned_long *)&f);
  }
  AVar2 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
  if (((AVar2.ptr)->size_ != 6) && (kj::_::Debug::minSeverity < 3)) {
    local_1a8.builder.segment = (SegmentBuilder *)CONCAT44(local_1a8.builder.segment._4_4_,6);
    AVar2 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
    f.exception = (Exception *)(AVar2.ptr)->size_;
    kj::_::Debug::log<char_const(&)[68],unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x402,ERROR,
               "\"failed: expected \" \"(6u) == (builder.getSegmentsForOutput()[0].size())\", 6u, builder.getSegmentsForOutput()[0].size()"
               ,(char (*) [68])"failed: expected (6u) == (builder.getSegmentsForOutput()[0].size())"
               ,(uint *)&local_1a8,(unsigned_long *)&f);
  }
  local_138.builder.segment = root._builder.segment;
  local_138.builder.capTable = root._builder.capTable;
  local_138.builder.pointer = root._builder.pointers;
  AnyPointer::Builder::getAs<capnproto_test::capnp::test::TestNewVersion>
            ((BuilderFor<capnproto_test::capnp::test::TestNewVersion> *)&f,&local_138);
  capnproto_test::capnp::test::TestNewVersion::Builder::getOld2((Builder *)&local_1a8,(Builder *)&f)
  ;
  bVar1 = operator==("foo",(Builder *)&local_1a8);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    local_138.builder.segment = root._builder.segment;
    local_138.builder.capTable = root._builder.capTable;
    local_138.builder.pointer = root._builder.pointers;
    AnyPointer::Builder::getAs<capnproto_test::capnp::test::TestNewVersion>
              ((BuilderFor<capnproto_test::capnp::test::TestNewVersion> *)&f,&local_138);
    capnproto_test::capnp::test::TestNewVersion::Builder::getOld2
              ((Builder *)&local_1a8,(Builder *)&f);
    kj::_::Debug::log<char_const(&)[96],char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x405,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (root.getAnyPointerField().getAs<test::TestNewVersion>().getOld2())\", \"foo\", root.getAnyPointerField().getAs<test::TestNewVersion>().getOld2()"
               ,(char (*) [96])
                "failed: expected (\"foo\") == (root.getAnyPointerField().getAs<test::TestNewVersion>().getOld2())"
               ,(char (*) [4])"foo",(Builder *)&local_1a8);
  }
  AVar2 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
  if (AVar2.size_ == 3) {
    AVar2 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
    if (((AVar2.ptr)->size_ != 6) && (kj::_::Debug::minSeverity < 3)) {
      local_1a8.builder.segment = (SegmentBuilder *)CONCAT44(local_1a8.builder.segment._4_4_,6);
      AVar2 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
      f.exception = (Exception *)(AVar2.ptr)->size_;
      kj::_::Debug::log<char_const(&)[68],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x40a,ERROR,
                 "\"failed: expected \" \"(6u) == (builder.getSegmentsForOutput()[0].size())\", 6u, builder.getSegmentsForOutput()[0].size()"
                 ,(char (*) [68])
                  "failed: expected (6u) == (builder.getSegmentsForOutput()[0].size())",
                 (uint *)&local_1a8,(unsigned_long *)&f);
    }
    AVar2 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
    if ((AVar2.ptr[1].size_ != 6) && (kj::_::Debug::minSeverity < 3)) {
      local_1a8.builder.segment = (SegmentBuilder *)CONCAT44(local_1a8.builder.segment._4_4_,6);
      AVar2 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
      f.exception = (Exception *)AVar2.ptr[1].size_;
      kj::_::Debug::log<char_const(&)[68],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x40b,ERROR,
                 "\"failed: expected \" \"(6u) == (builder.getSegmentsForOutput()[1].size())\", 6u, builder.getSegmentsForOutput()[1].size()"
                 ,(char (*) [68])
                  "failed: expected (6u) == (builder.getSegmentsForOutput()[1].size())",
                 (uint *)&local_1a8,(unsigned_long *)&f);
    }
    AVar2 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
    if ((AVar2.ptr[2].size_ != 2) && (kj::_::Debug::minSeverity < 3)) {
      local_1a8.builder.segment = (SegmentBuilder *)CONCAT44(local_1a8.builder.segment._4_4_,2);
      AVar2 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
      f.exception = (Exception *)AVar2.ptr[2].size_;
      kj::_::Debug::log<char_const(&)[68],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x40c,ERROR,
                 "\"failed: expected \" \"(2u) == (builder.getSegmentsForOutput()[2].size())\", 2u, builder.getSegmentsForOutput()[2].size()"
                 ,(char (*) [68])
                  "failed: expected (2u) == (builder.getSegmentsForOutput()[2].size())",
                 (uint *)&local_1a8,(unsigned_long *)&f);
    }
    MallocMessageBuilder::~MallocMessageBuilder(&builder);
    return;
  }
  local_138.builder.segment = (SegmentBuilder *)CONCAT44(local_138.builder.segment._4_4_,3);
  AVar2 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
  local_1a8.builder.segment = (SegmentBuilder *)AVar2.size_;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_long>
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
             ,0x409,FAILED,"(3u) == (builder.getSegmentsForOutput().size())",
             "3u, builder.getSegmentsForOutput().size()",(uint *)&local_138,
             (unsigned_long *)&local_1a8);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

TEST(Encoding, UpgradeStructInBuilderDoubleFarPointers) {
  // Force allocation of a double-Far pointer.

  MallocMessageBuilder builder(6, AllocationStrategy::FIXED_SIZE);
  auto root = builder.initRoot<test::TestAnyPointer>();

  root.getAnyPointerField().initAs<test::TestOldVersion>().setOld2("foo");

  // We should have allocated all of the first segment.
  EXPECT_EQ(1u, builder.getSegmentsForOutput().size());
  EXPECT_EQ(6u, builder.getSegmentsForOutput()[0].size());

  // Now if we upgrade...
  EXPECT_EQ("foo", root.getAnyPointerField().getAs<test::TestNewVersion>().getOld2());

  // We should have allocated the new struct in a new segment, and also allocated the far pointer
  // landing pad in yet another segment.
  ASSERT_EQ(3u, builder.getSegmentsForOutput().size());
  EXPECT_EQ(6u, builder.getSegmentsForOutput()[0].size());
  EXPECT_EQ(6u, builder.getSegmentsForOutput()[1].size());
  EXPECT_EQ(2u, builder.getSegmentsForOutput()[2].size());
}